

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O1

void __thiscall
arangodb::velocypack::Validator::validateObject(Validator *this,uint8_t *ptr,size_t length)

{
  byte *ptr_00;
  long lVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  __node_base_ptr p_Var5;
  _Hash_node_base *p_Var6;
  byte bVar7;
  ValueLength length_00;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *puVar8;
  undefined1 *puVar9;
  int64_t iVar10;
  ValueLength VVar11;
  ulong uVar12;
  __node_base_ptr p_Var13;
  Exception *pEVar14;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *puVar15;
  _Hash_node_base *p_Var16;
  ulong uVar17;
  char *pcVar18;
  ulong uVar19;
  byte *ptr_01;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *puVar20;
  _Node_iterator_base<unsigned_long,_false> __it;
  bool bVar21;
  __node_base_ptr p_Var22;
  ulong uVar23;
  long lVar24;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *ptr_02;
  byte *pbVar25;
  long lVar26;
  ulong *puVar27;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *puVar28;
  undefined1 *puStack_108;
  ulong uStack_f0;
  _Head_base<0UL,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_*,_false>
  _Stack_e8;
  long lStack_e0;
  Validator *pVStack_d8;
  _Head_base<0UL,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_*,_false>
  _Stack_d0;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *puStack_c8;
  long lStack_c0;
  undefined1 auStack_b8 [88];
  undefined8 uStack_60;
  byte *pbStack_50;
  Validator *pVStack_48;
  byte *pbStack_40;
  byte *pbStack_38;
  
  if (*ptr == '\x14') {
    uStack_60 = 0x1157ce;
    pVStack_48 = this;
    validateBufferLength(this,5,length,true);
    pbStack_50 = ptr + 1;
    uStack_60 = 0x1157e6;
    VVar11 = ReadVariableLengthValue<false>(&pbStack_50,ptr + length + 1);
    ptr_01 = pbStack_50;
    if ((VVar11 <= length) && (4 < VVar11)) {
      pbStack_50 = ptr + (VVar11 - 1);
      uStack_60 = 0x115813;
      VVar11 = ReadVariableLengthValue<true>(&pbStack_50,ptr + VVar11);
      if (VVar11 != 0) {
        pbVar25 = pbStack_50 + 1;
        pbStack_50 = ptr_01;
        do {
          if (pbVar25 <= ptr_01) {
            uStack_60 = 0x115958;
            pbStack_50 = ptr_01;
            pEVar14 = (Exception *)__cxa_allocate_exception(0x18);
            pcVar18 = "Object items number is out of bounds";
            goto LAB_0011597d;
          }
          uStack_60 = 0x115854;
          validatePart(pVStack_48,ptr_01,(long)pbVar25 - (long)ptr_01,true);
          bVar2 = *ptr_01;
          pbStack_40 = ptr_01;
          if (0x7f < (ulong)bVar2 - 0x40) {
            if ((bVar2 & 0xf0) == 0x30) {
              uStack_60 = 0x11587f;
              iVar10 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                       getSmallInt((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                    *)&pbStack_40);
              if (iVar10 < 1) {
LAB_00115964:
                uStack_60 = 0x115973;
                pbStack_50 = ptr_01;
                pEVar14 = (Exception *)__cxa_allocate_exception(0x18);
                pcVar18 = "Invalid object key type";
                goto LAB_0011597d;
              }
            }
            else if ((bVar2 & 0xf8) != 0x28) goto LAB_00115964;
          }
          length_00 = (ValueLength)"\x01\x01"[*pbStack_40];
          if (length_00 == 0) {
            uStack_60 = 0x1158b2;
            length_00 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                        byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                         *)&pbStack_40,pbStack_40);
          }
          if (((ulong)bVar2 - 0x40 < 0x80) && (pVStack_48->options->validateUtf8Strings == true)) {
            uStack_60 = 0x1158d9;
            validatePart(pVStack_48,ptr_01,length_00,true);
          }
          ptr_00 = ptr_01 + length_00;
          uStack_60 = 0x1158f5;
          validatePart(pVStack_48,ptr_00,(long)pbVar25 - (long)ptr_00,true);
          uVar19 = (ulong)"\x01\x01"[ptr_01[length_00]];
          pbStack_38 = ptr_00;
          if (uVar19 == 0) {
            uStack_60 = 0x115919;
            uVar19 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                     byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                      *)&pbStack_38,ptr_00);
          }
          VVar11 = VVar11 - 1;
          ptr_01 = ptr_00 + uVar19;
        } while (VVar11 != 0);
        if (ptr_01 == pbVar25) {
          return;
        }
        uStack_60 = 0x1159c0;
        pbStack_50 = ptr_01;
        pEVar14 = (Exception *)__cxa_allocate_exception(0x18);
        pcVar18 = "Object has more members than specified";
        goto LAB_0011597d;
      }
    }
    uStack_60 = 0x1159aa;
    pEVar14 = (Exception *)__cxa_allocate_exception(0x18);
    pcVar18 = "Object length value is out of bounds";
LAB_0011597d:
    uStack_60 = 0x11598a;
    Exception::Exception(pEVar14,ValidatorInvalidLength,pcVar18);
    uStack_60 = 0x1159a0;
    __cxa_throw(pEVar14,&Exception::typeinfo,Exception::~Exception);
  }
  if (7 < (byte)(*ptr - 0xb)) {
    return;
  }
  bVar2 = *ptr;
  lVar26 = ((ulong)((ulong)bVar2 < 0xf) << 2 | 0xfffffffffffffff1) + (ulong)bVar2;
  bVar7 = (byte)lVar26;
  lVar24 = 1L << (bVar7 & 0x3f);
  pVStack_d8 = this;
  validateBufferLength(this,(2L << (bVar7 & 0x3f)) + 2,length,true);
  puVar27 = (ulong *)(ptr + 1);
  lVar1 = lVar24 + -1;
  switch(lVar1) {
  case 0:
    uVar19 = (ulong)(byte)*puVar27;
    break;
  case 1:
    uVar19 = (ulong)*(ushort *)(ptr + 1);
    break;
  case 2:
    uVar12 = (ulong)((uint)ptr[2] << 8 | (uint)ptr[3] << 0x10);
    uVar19 = (ulong)ptr[1];
    goto LAB_00115ac3;
  case 3:
    uVar19 = (ulong)*(uint *)(ptr + 1);
    break;
  case 4:
    uVar3 = (uint)*puVar27;
    uVar19 = (ulong)ptr[5];
    goto LAB_00115aa6;
  case 5:
    uVar3 = (uint)*puVar27;
    uVar19 = (ulong)*(ushort *)(ptr + 5);
LAB_00115aa6:
    uVar19 = uVar19 << 0x20 | (ulong)uVar3;
    break;
  case 6:
    uVar12 = (ulong)*(uint3 *)(ptr + 5) << 0x20;
    uVar19 = (ulong)(uint)*puVar27;
LAB_00115ac3:
    uVar19 = uVar19 | uVar12;
    break;
  case 7:
    uVar19 = *puVar27;
    break;
  default:
    uVar19 = 0;
  }
  lStack_e0 = lVar26;
  if (length < uVar19) {
    pEVar14 = (Exception *)__cxa_allocate_exception(0x18);
    pcVar18 = "Object length is out of bounds";
    goto LAB_001162c4;
  }
  if ((bVar2 != 0x12) && (bVar2 != 0xe)) {
    puVar27 = (ulong *)((long)puVar27 + lVar24);
    switch(lVar1) {
    case 0:
      uStack_f0 = (ulong)(byte)*puVar27;
      break;
    case 1:
      uStack_f0 = (ulong)(ushort)*puVar27;
      break;
    case 2:
      uVar12 = (ulong)((uint)*(byte *)((long)puVar27 + 1) << 8 |
                      (uint)*(byte *)((long)puVar27 + 2) << 0x10);
      uStack_f0 = (ulong)(byte)*puVar27;
      goto LAB_00115c26;
    case 3:
      uStack_f0 = (ulong)(uint)*puVar27;
      break;
    case 4:
      uVar3 = (uint)*puVar27;
      uVar12 = (ulong)*(byte *)((long)puVar27 + 4);
      goto LAB_00115c0a;
    case 5:
      uVar3 = (uint)*puVar27;
      uVar12 = (ulong)*(ushort *)((long)puVar27 + 4);
LAB_00115c0a:
      uStack_f0 = uVar12 << 0x20 | (ulong)uVar3;
      break;
    case 6:
      uVar12 = (ulong)*(uint3 *)((long)puVar27 + 4) << 0x20;
      uStack_f0 = (ulong)(uint)*puVar27;
LAB_00115c26:
      uStack_f0 = uStack_f0 | uVar12;
      break;
    case 7:
      uStack_f0 = *puVar27;
      break;
    default:
      uStack_f0 = 0;
    }
    if (uStack_f0 == 0) goto LAB_0011624d;
    puVar8 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              *)((long)puVar27 + lVar24);
    puVar15 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               *)((long)&(puVar8->_M_h)._M_bucket_count + (-2L << (bVar7 & 0x3f)));
    puVar28 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               *)(ptr + uVar19);
    ptr_02 = puVar8;
    puVar20 = puVar15;
    if (puVar28 < puVar15) {
      puVar20 = puVar28;
    }
    for (; (ptr_02 < puVar20 && (*(byte *)&(ptr_02->_M_h)._M_buckets == 0));
        ptr_02 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                  *)((long)&(ptr_02->_M_h)._M_buckets + 1)) {
    }
    if (ptr_02 != puVar15 && ptr_02 != puVar8) {
      pEVar14 = (Exception *)__cxa_allocate_exception(0x18);
      pcVar18 = "Object padding is invalid";
      goto LAB_001162c4;
    }
    puVar28 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               *)((long)puVar28 - (uStack_f0 << (bVar7 & 0x3f)));
    if (((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *)(ptr + lVar24 * 2) <= puVar28) && (ptr_02 <= puVar28)) {
      lVar24 = -lVar24;
      goto LAB_00115ccb;
    }
    goto LAB_00116263;
  }
  ptr_02 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            *)(ptr + uVar19);
  puVar27 = (ulong *)((long)ptr_02 - lVar24);
  switch(lVar1) {
  case 0:
    uStack_f0 = (ulong)(byte)*puVar27;
    break;
  case 1:
    uStack_f0 = (ulong)(ushort)*puVar27;
    break;
  case 2:
    uVar19 = (ulong)((uint)*(byte *)((long)puVar27 + 1) << 8 |
                    (uint)*(byte *)((long)puVar27 + 2) << 0x10);
    uStack_f0 = (ulong)(byte)*puVar27;
    goto LAB_00115b92;
  case 3:
    uStack_f0 = (ulong)(uint)*puVar27;
    break;
  case 4:
    uVar3 = (uint)*puVar27;
    uVar19 = (ulong)*(byte *)((long)puVar27 + 4);
    goto LAB_00115b73;
  case 5:
    uVar3 = (uint)*puVar27;
    uVar19 = (ulong)*(ushort *)((long)puVar27 + 4);
LAB_00115b73:
    uStack_f0 = uVar19 << 0x20 | (ulong)uVar3;
    break;
  case 6:
    uVar19 = (ulong)*(uint3 *)((long)puVar27 + 4) << 0x20;
    uStack_f0 = (ulong)(uint)*puVar27;
LAB_00115b92:
    uStack_f0 = uStack_f0 | uVar19;
    break;
  case 7:
    uStack_f0 = *puVar27;
    break;
  default:
    uStack_f0 = 0;
  }
  if (uStack_f0 == 0) {
LAB_0011624d:
    pEVar14 = (Exception *)__cxa_allocate_exception(0x18);
    pcVar18 = "Object nrItems value is invalid";
  }
  else {
    puVar28 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               *)((long)puVar27 - (uStack_f0 << (bVar7 & 0x3f)));
    if ((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
         *)(ptr + lVar24) <= puVar28) {
      lVar24 = lVar24 * -2;
LAB_00115ccb:
      if (puVar28 <=
          (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           *)(ptr + lVar24 + length)) {
        _Stack_e8._M_head_impl =
             (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              *)0x0;
        puVar9 = auStack_b8;
        if (uStack_f0 < 0x11) {
          puStack_108 = (undefined1 *)0x0;
        }
        else if (uStack_f0 < 0x81) {
          puVar9 = (undefined1 *)operator_new__(uStack_f0 * 8);
          puStack_108 = puVar9;
        }
        else {
          _Stack_e8._M_head_impl =
               (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                *)operator_new(0x38);
          ((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)_Stack_e8._M_head_impl)->_M_buckets = (__buckets_ptr)0x0;
          ((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)_Stack_e8._M_head_impl)->_M_bucket_count = 0;
          *(undefined8 *)
           &((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)_Stack_e8._M_head_impl)->_M_rehash_policy = 0;
          (((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             *)_Stack_e8._M_head_impl)->_M_rehash_policy)._M_next_resize = 0;
          ((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)_Stack_e8._M_head_impl)->_M_single_bucket = (__node_base_ptr)0x0;
          (((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             *)_Stack_e8._M_head_impl)->_M_before_begin)._M_nxt = (_Hash_node_base *)0x0;
          ((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)_Stack_e8._M_head_impl)->_M_element_count = 0;
          ((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)_Stack_e8._M_head_impl)->_M_buckets =
               &((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)_Stack_e8._M_head_impl)->_M_single_bucket;
          ((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)_Stack_e8._M_head_impl)->_M_bucket_count = 1;
          (((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             *)_Stack_e8._M_head_impl)->_M_rehash_policy)._M_max_load_factor = 1.0;
          (((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             *)_Stack_e8._M_head_impl)->_M_rehash_policy)._M_next_resize = 0;
          ((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)_Stack_e8._M_head_impl)->_M_single_bucket = (__node_base_ptr)0x0;
          puStack_108 = (undefined1 *)0x0;
          _Stack_d0._M_head_impl =
               (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                *)0x0;
          std::
          unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
          ::~unique_ptr((unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                         *)&_Stack_d0);
        }
        uVar19 = 0;
        for (; ptr_02 < puVar28;
            ptr_02 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)((long)&(ptr_02->_M_h)._M_buckets + uVar12 + VVar11)) {
          validatePart(pVStack_d8,(uint8_t *)ptr_02,(long)puVar28 - (long)ptr_02,true);
          bVar2 = *(byte *)&(ptr_02->_M_h)._M_buckets;
          _Stack_d0._M_head_impl = ptr_02;
          if (0x7f < (ulong)bVar2 - 0x40) {
            if ((bVar2 & 0xf0) == 0x30) {
              iVar10 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                       getSmallInt((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                    *)&_Stack_d0);
              if (iVar10 < 1) {
LAB_001161fe:
                pEVar14 = (Exception *)__cxa_allocate_exception(0x18);
                Exception::Exception(pEVar14,ValidatorInvalidLength,"Invalid object key type");
                __cxa_throw(pEVar14,&Exception::typeinfo,Exception::~Exception);
              }
            }
            else if ((bVar2 & 0xf8) != 0x28) goto LAB_001161fe;
          }
          VVar11 = (ValueLength)"\x01\x01"[*(byte *)&((_Stack_d0._M_head_impl)->_M_h)._M_buckets];
          if (VVar11 == 0) {
            VVar11 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                     byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                      *)&_Stack_d0,(uint8_t *)_Stack_d0._M_head_impl);
          }
          if (((ulong)bVar2 - 0x40 < 0x80) && (pVStack_d8->options->validateUtf8Strings == true)) {
            validatePart(pVStack_d8,(uint8_t *)ptr_02,VVar11,true);
          }
          puVar20 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)((long)&(ptr_02->_M_h)._M_buckets + VVar11);
          if (puVar28 <= puVar20) {
            pEVar14 = (Exception *)__cxa_allocate_exception(0x18);
            Exception::Exception
                      (pEVar14,ValidatorInvalidLength,"Object value leaking into index table");
            __cxa_throw(pEVar14,&Exception::typeinfo,Exception::~Exception);
          }
          validatePart(pVStack_d8,(uint8_t *)puVar20,(long)puVar28 - (long)puVar20,true);
          lStack_c0 = (long)ptr_02 - (long)ptr;
          if (uStack_f0 < 0x81) {
            *(long *)(puVar9 + uVar19 * 8) = lStack_c0;
          }
          else {
            std::
            _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::_M_emplace<unsigned_long&>
                      ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)_Stack_e8._M_head_impl,&lStack_c0);
          }
          uVar12 = (ulong)"\x01\x01"[*(byte *)&(puVar20->_M_h)._M_buckets];
          puStack_c8 = puVar20;
          if (uVar12 == 0) {
            uVar12 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                     byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                      *)&puStack_c8,(uint8_t *)puVar20);
          }
          uVar19 = uVar19 + 1;
          if (uStack_f0 < uVar19) {
            pEVar14 = (Exception *)__cxa_allocate_exception(0x18);
            Exception::Exception
                      (pEVar14,ValidatorInvalidLength,
                       "Object value has more key/value pairs than announced");
            __cxa_throw(pEVar14,&Exception::typeinfo,Exception::~Exception);
          }
        }
        if (uVar19 < uStack_f0) {
          pEVar14 = (Exception *)__cxa_allocate_exception(0x18);
          Exception::Exception
                    (pEVar14,ValidatorInvalidLength,"Object has fewer items than in index");
          __cxa_throw(pEVar14,&Exception::typeinfo,Exception::~Exception);
        }
        bVar2 = (byte)lStack_e0;
        if (uStack_f0 < 0x81) {
          lVar24 = 0;
          do {
            lVar26 = lVar24 << (bVar2 & 0x3f);
            switch(lVar1) {
            case 0:
              uVar19 = (ulong)*(byte *)((long)&(puVar28->_M_h)._M_buckets + lVar26);
              break;
            case 1:
              uVar19 = (ulong)*(ushort *)((long)&(puVar28->_M_h)._M_buckets + lVar26);
              break;
            case 2:
              uVar12 = (ulong)((uint)*(byte *)((long)&(puVar28->_M_h)._M_buckets + lVar26 + 1) << 8
                              | (uint)*(byte *)((long)&(puVar28->_M_h)._M_buckets + lVar26 + 2) <<
                                0x10);
              uVar19 = (ulong)*(byte *)((long)&(puVar28->_M_h)._M_buckets + lVar26);
              goto LAB_00115f70;
            case 3:
              uVar19 = (ulong)*(uint *)((long)&(puVar28->_M_h)._M_buckets + lVar26);
              break;
            case 4:
              uVar3 = *(uint *)((long)&(puVar28->_M_h)._M_buckets + lVar26);
              uVar19 = (ulong)*(byte *)((long)&(puVar28->_M_h)._M_buckets + lVar26 + 4);
              goto LAB_00115f4f;
            case 5:
              uVar3 = *(uint *)((long)&(puVar28->_M_h)._M_buckets + lVar26);
              uVar19 = (ulong)*(ushort *)((long)&(puVar28->_M_h)._M_buckets + lVar26 + 4);
LAB_00115f4f:
              uVar12 = (ulong)uVar3;
              uVar19 = uVar19 << 0x20;
              goto LAB_00115f70;
            case 6:
              uVar12 = (ulong)CONCAT12(*(byte *)((long)&(puVar28->_M_h)._M_buckets + lVar26 + 6),
                                       *(undefined2 *)
                                        ((long)&(puVar28->_M_h)._M_buckets + lVar26 + 4)) << 0x20;
              uVar19 = (ulong)*(uint *)((long)&(puVar28->_M_h)._M_buckets + lVar26);
LAB_00115f70:
              uVar19 = uVar19 | uVar12;
              break;
            case 7:
              uVar19 = *(ulong *)((long)&(puVar28->_M_h)._M_buckets + lVar26);
              break;
            default:
              uVar19 = 0;
            }
            uVar12 = 0;
            uVar17 = uStack_f0;
            do {
              bVar21 = false;
              if (uVar17 <= uVar12) goto LAB_00115fa8;
              uVar23 = uVar17 + uVar12 >> 1;
              uVar4 = *(ulong *)(puVar9 + uVar23 * 8);
              if (uVar4 < uVar19) {
                uVar12 = uVar23 + 1;
              }
              if (uVar4 <= uVar19) {
                uVar23 = uVar17;
              }
              uVar17 = uVar23;
            } while (uVar19 != uVar4);
            bVar21 = true;
LAB_00115fa8:
            if (!bVar21) {
              pEVar14 = (Exception *)__cxa_allocate_exception(0x18);
              Exception::Exception(pEVar14,ValidatorInvalidLength,"Object has invalid index offset")
              ;
              __cxa_throw(pEVar14,&Exception::typeinfo,Exception::~Exception);
            }
            lVar24 = lVar24 + 1;
          } while (lVar24 != uStack_f0 + (uStack_f0 == 0));
        }
        else {
          uVar19 = 0;
          do {
            lVar24 = uVar19 << (bVar2 & 0x3f);
            switch(lVar1) {
            case 0:
              p_Var16 = (_Hash_node_base *)
                        (ulong)*(byte *)((long)&(puVar28->_M_h)._M_buckets + lVar24);
              break;
            case 1:
              p_Var16 = (_Hash_node_base *)
                        (ulong)*(ushort *)((long)&(puVar28->_M_h)._M_buckets + lVar24);
              break;
            case 2:
              uVar17 = (ulong)((uint)*(byte *)((long)&(puVar28->_M_h)._M_buckets + lVar24 + 1) << 8
                              | (uint)*(byte *)((long)&(puVar28->_M_h)._M_buckets + lVar24 + 2) <<
                                0x10);
              uVar12 = (ulong)*(byte *)((long)&(puVar28->_M_h)._M_buckets + lVar24);
              goto LAB_0011605b;
            case 3:
              p_Var16 = (_Hash_node_base *)
                        (ulong)*(uint *)((long)&(puVar28->_M_h)._M_buckets + lVar24);
              break;
            case 4:
              uVar3 = *(uint *)((long)&(puVar28->_M_h)._M_buckets + lVar24);
              uVar12 = (ulong)*(byte *)((long)&(puVar28->_M_h)._M_buckets + lVar24 + 4);
              goto LAB_0011603c;
            case 5:
              uVar3 = *(uint *)((long)&(puVar28->_M_h)._M_buckets + lVar24);
              uVar12 = (ulong)*(ushort *)((long)&(puVar28->_M_h)._M_buckets + lVar24 + 4);
LAB_0011603c:
              uVar17 = (ulong)uVar3;
              uVar12 = uVar12 << 0x20;
              goto LAB_0011605b;
            case 6:
              uVar17 = (ulong)CONCAT12(*(byte *)((long)&(puVar28->_M_h)._M_buckets + lVar24 + 6),
                                       *(undefined2 *)
                                        ((long)&(puVar28->_M_h)._M_buckets + lVar24 + 4)) << 0x20;
              uVar12 = (ulong)*(uint *)((long)&(puVar28->_M_h)._M_buckets + lVar24);
LAB_0011605b:
              p_Var16 = (_Hash_node_base *)(uVar12 | uVar17);
              break;
            case 7:
              p_Var16 = *(_Hash_node_base **)((long)&(puVar28->_M_h)._M_buckets + lVar24);
              break;
            default:
              p_Var16 = (_Hash_node_base *)0x0;
            }
            uVar12 = ((_Stack_e8._M_head_impl)->_M_h)._M_bucket_count;
            uVar17 = (ulong)p_Var16 % uVar12;
            p_Var5 = ((_Stack_e8._M_head_impl)->_M_h)._M_buckets[uVar17];
            p_Var13 = (__node_base_ptr)0x0;
            if ((p_Var5 != (__node_base_ptr)0x0) &&
               (p_Var13 = p_Var5, p_Var22 = p_Var5->_M_nxt, p_Var16 != p_Var5->_M_nxt[1]._M_nxt)) {
              while (p_Var6 = p_Var22->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
                p_Var13 = (__node_base_ptr)0x0;
                if (((ulong)p_Var6[1]._M_nxt % uVar12 != uVar17) ||
                   (p_Var13 = p_Var22, p_Var22 = p_Var6, p_Var16 == p_Var6[1]._M_nxt))
                goto LAB_001160c0;
              }
              p_Var13 = (__node_base_ptr)0x0;
            }
LAB_001160c0:
            if (p_Var13 == (__node_base_ptr)0x0) {
              __it._M_cur = (__node_type *)0x0;
            }
            else {
              __it._M_cur = (__node_type *)p_Var13->_M_nxt;
            }
            if (__it._M_cur == (__node_type *)0x0) {
              pEVar14 = (Exception *)__cxa_allocate_exception(0x18);
              Exception::Exception(pEVar14,ValidatorInvalidLength,"Object has invalid index offset")
              ;
              __cxa_throw(pEVar14,&Exception::typeinfo,Exception::~Exception);
            }
            std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::erase(&(_Stack_e8._M_head_impl)->_M_h,(const_iterator)__it._M_cur);
            uVar19 = uVar19 + 1;
          } while (uVar19 != uStack_f0);
        }
        std::
        unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
        ::~unique_ptr((unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                       *)&_Stack_e8);
        if (puStack_108 != (undefined1 *)0x0) {
          operator_delete__(puStack_108);
        }
        return;
      }
    }
LAB_00116263:
    pEVar14 = (Exception *)__cxa_allocate_exception(0x18);
    pcVar18 = "Object index table is out of bounds";
  }
LAB_001162c4:
  Exception::Exception(pEVar14,ValidatorInvalidLength,pcVar18);
  __cxa_throw(pEVar14,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Validator::validateObject(uint8_t const* ptr, std::size_t length) {
  uint8_t head = *ptr;

  if (head == 0x14U) {
    // compact object
    validateCompactObject(ptr, length);
  } else if (head >= 0x0bU && head <= 0x12U) {
    // regular object
    validateIndexedObject(ptr, length);
  } else if (head == 0x0aU) {
    // empty object. always valid
  }
}